

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult
testing::internal::CmpHelperEQFailure<(anonymous_namespace)::Bar,(anonymous_namespace)::Bar>
          (char *lhs_expression,char *rhs_expression,Bar *lhs,Bar *rhs)

{
  Bar *pBVar1;
  Bar *value;
  AssertionResult AVar2;
  string local_60;
  string local_40;
  
  pBVar1 = rhs;
  FormatForComparisonFailureMessage<(anonymous_namespace)::Bar,(anonymous_namespace)::Bar>
            (&local_60,(internal *)lhs,lhs,rhs);
  FormatForComparisonFailureMessage<(anonymous_namespace)::Bar,(anonymous_namespace)::Bar>
            (&local_40,(internal *)rhs,value,pBVar1);
  EqFailure((internal *)lhs_expression,"p.get_state()",rhs_expression,&local_60,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  AVar2 = (AssertionResult)std::__cxx11::string::~string((string *)&local_60);
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}